

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRBlock * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::allocate<>
          (ObjectPool<spirv_cross::SPIRBlock> *this)

{
  uint uVar1;
  SPIRBlock *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRBlock **ppSVar4;
  SPIRBlock *ptr;
  uint local_2c;
  SPIRBlock *pSStack_28;
  uint i;
  SPIRBlock *ptr_1;
  ObjectPool<spirv_cross::SPIRBlock> *pOStack_18;
  uint num_objects;
  ObjectPool<spirv_cross::SPIRBlock> *this_local;
  
  pOStack_18 = this;
  bVar2 = VectorView<spirv_cross::SPIRBlock_*>::empty
                    (&(this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<spirv_cross::SPIRBlock,_spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_28 = (SPIRBlock *)malloc((ulong)ptr_1._4_4_ * 0x3d0);
    if (pSStack_28 == (SPIRBlock *)0x0) {
      return (SPIRBlock *)0x0;
    }
    for (local_2c = 0; local_2c < ptr_1._4_4_; local_2c = local_2c + 1) {
      ptr = pSStack_28 + local_2c;
      SmallVector<spirv_cross::SPIRBlock_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRBlock,spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRBlock*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRBlock,spirv_cross::ObjectPool<spirv_cross::SPIRBlock>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffd8);
  }
  ppSVar4 = VectorView<spirv_cross::SPIRBlock_*>::back
                      (&(this->vacants).super_VectorView<spirv_cross::SPIRBlock_*>);
  this_00 = *ppSVar4;
  SmallVector<spirv_cross::SPIRBlock_*,_0UL>::pop_back(&this->vacants);
  memset(this_00,0,0x3d0);
  SPIRBlock::SPIRBlock(this_00);
  return this_00;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}